

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

int Curl_conn_cf_poll(Curl_cfilter *cf,Curl_easy *data,timediff_t timeout_ms)

{
  int iVar1;
  ushort local_72;
  uint local_70;
  uint uStack_6c;
  short events;
  uint npfds;
  uint i;
  pollfd pfds [5];
  easy_pollset ps;
  timediff_t timeout_ms_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_70 = 0;
  ps._24_8_ = timeout_ms;
  memset(pfds + 4,0,0x20);
  memset(&npfds,0,0x28);
  Curl_conn_cf_adjust_pollset(cf,data,(easy_pollset *)(pfds + 4));
  for (uStack_6c = 0; uStack_6c < (uint)ps.sockets[3]; uStack_6c = uStack_6c + 1) {
    local_72 = (ushort)((*(byte *)((long)ps.sockets + (ulong)uStack_6c + 0x10) & 1) != 0);
    if ((*(byte *)((long)ps.sockets + (ulong)uStack_6c + 0x10) & 2) != 0) {
      local_72 = local_72 | 4;
    }
    if (local_72 != 0) {
      (&npfds)[(ulong)local_70 * 2] = ps.sockets[(ulong)uStack_6c - 2];
      pfds[(ulong)local_70 - 1].events = local_72;
      local_70 = local_70 + 1;
    }
  }
  iVar1 = Curl_poll((pollfd *)&npfds,local_70,ps._24_8_);
  return iVar1;
}

Assistant:

int Curl_conn_cf_poll(struct Curl_cfilter *cf,
                      struct Curl_easy *data,
                      timediff_t timeout_ms)
{
  struct easy_pollset ps;
  struct pollfd pfds[MAX_SOCKSPEREASYHANDLE];
  unsigned int i, npfds = 0;

  DEBUGASSERT(cf);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  memset(&ps, 0, sizeof(ps));
  memset(pfds, 0, sizeof(pfds));

  Curl_conn_cf_adjust_pollset(cf, data, &ps);
  DEBUGASSERT(ps.num <= MAX_SOCKSPEREASYHANDLE);
  for(i = 0; i < ps.num; ++i) {
    short events = 0;
    if(ps.actions[i] & CURL_POLL_IN) {
      events |= POLLIN;
    }
    if(ps.actions[i] & CURL_POLL_OUT) {
      events |= POLLOUT;
    }
    if(events) {
      pfds[npfds].fd = ps.sockets[i];
      pfds[npfds].events = events;
      ++npfds;
    }
  }

  if(!npfds)
    DEBUGF(infof(data, "no sockets to poll!"));
  return Curl_poll(pfds, npfds, timeout_ms);
}